

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O1

void __thiscall
charls::jpeg_stream_reader::validate_marker_code
          (jpeg_stream_reader *this,jpeg_marker_code marker_code)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,marker_code) - 0xe0U < 0x10) {
switchD_00123af9_caseD_f8:
    return;
  }
  switch((int)CONCAT71(in_register_00000031,marker_code)) {
  case 0xf7:
    if (this->state_ != scan_section) {
      return;
    }
    validate_marker_code();
    break;
  case 0xf8:
  case 0xfe:
    goto switchD_00123af9_caseD_f8;
  case 0xf9:
    goto switchD_00123af9_caseD_f9;
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
    goto switchD_00123af9_caseD_fa;
  }
  switch((int)CONCAT71(in_register_00000031,marker_code)) {
  default:
switchD_00123af9_caseD_fa:
    if ((marker_code & jpegls_preset_parameters) != 0xd0) {
      impl::throw_jpegls_error(UnknownJpegMarker);
    }
    impl::throw_jpegls_error(unexpected_restart_marker);
  case 0xd8:
    impl::throw_jpegls_error(duplicate_start_of_image_marker);
  case 0xd9:
    impl::throw_jpegls_error(unexpected_end_of_image_marker);
  case 0xda:
    if (this->state_ == scan_section) {
      return;
    }
    validate_marker_code();
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc5:
  case 0xc6:
  case 199:
  case 0xc9:
  case 0xca:
  case 0xcb:
switchD_00123af9_caseD_f9:
    impl::throw_jpegls_error(UnsupportedEncoding);
  case 0xdd:
    goto switchD_00123af9_caseD_f8;
  }
}

Assistant:

void jpeg_stream_reader::validate_marker_code(const jpeg_marker_code marker_code) const
{
    // ISO/IEC 14495-1, C.1.1. defines the following markers as valid for a JPEG-LS byte stream:
    // SOF55, LSE, SOI, EOI, SOS, DNL, DRI, RSTm, APPn and COM.
    // All other markers shall not be present.
    switch (marker_code)
    {
    case jpeg_marker_code::start_of_scan:
        if (UNLIKELY(state_ != state::scan_section))
            throw_jpegls_error(jpegls_errc::unexpected_marker_found);

        return;

    case jpeg_marker_code::start_of_frame_jpegls:
        if (UNLIKELY(state_ == state::scan_section))
            throw_jpegls_error(jpegls_errc::duplicate_start_of_frame_marker);

        return;

    case jpeg_marker_code::define_restart_interval:
    case jpeg_marker_code::jpegls_preset_parameters:
    case jpeg_marker_code::comment:
    case jpeg_marker_code::application_data0:
    case jpeg_marker_code::application_data1:
    case jpeg_marker_code::application_data2:
    case jpeg_marker_code::application_data3:
    case jpeg_marker_code::application_data4:
    case jpeg_marker_code::application_data5:
    case jpeg_marker_code::application_data6:
    case jpeg_marker_code::application_data7:
    case jpeg_marker_code::application_data8:
    case jpeg_marker_code::application_data9:
    case jpeg_marker_code::application_data10:
    case jpeg_marker_code::application_data11:
    case jpeg_marker_code::application_data12:
    case jpeg_marker_code::application_data13:
    case jpeg_marker_code::application_data14:
    case jpeg_marker_code::application_data15:
        return;

    // Check explicit for one of the other common JPEG encodings.
    case jpeg_marker_code::start_of_frame_baseline_jpeg:
    case jpeg_marker_code::start_of_frame_extended_sequential:
    case jpeg_marker_code::start_of_frame_progressive:
    case jpeg_marker_code::start_of_frame_lossless:
    case jpeg_marker_code::start_of_frame_differential_sequential:
    case jpeg_marker_code::start_of_frame_differential_progressive:
    case jpeg_marker_code::start_of_frame_differential_lossless:
    case jpeg_marker_code::start_of_frame_extended_arithmetic:
    case jpeg_marker_code::start_of_frame_progressive_arithmetic:
    case jpeg_marker_code::start_of_frame_lossless_arithmetic:
    case jpeg_marker_code::start_of_frame_jpegls_extended:
        throw_jpegls_error(jpegls_errc::encoding_not_supported);

    case jpeg_marker_code::start_of_image:
        throw_jpegls_error(jpegls_errc::duplicate_start_of_image_marker);

    case jpeg_marker_code::end_of_image:
        throw_jpegls_error(jpegls_errc::unexpected_end_of_image_marker);
    }

    if (is_restart_marker_code(marker_code))
        throw_jpegls_error(jpegls_errc::unexpected_restart_marker);

    throw_jpegls_error(jpegls_errc::unknown_jpeg_marker_found);
}